

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIntegers.h
# Opt level: O2

int64_t HighsIntegers::gcd(int64_t a,int64_t b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = -b;
  if (0 < b) {
    uVar3 = b;
  }
  uVar1 = uVar3;
  if (a != 0) {
    uVar1 = -a;
    if (0 < a) {
      uVar1 = a;
    }
    uVar2 = uVar1;
    if (b != 0) {
      do {
        uVar1 = uVar3;
        uVar3 = uVar2 % uVar1;
        uVar2 = uVar1;
      } while (uVar3 != 0);
    }
  }
  return uVar1;
}

Assistant:

static int64_t gcd(int64_t a, int64_t b) {
    assert(a != std::numeric_limits<int64_t>::min());
    assert(b != std::numeric_limits<int64_t>::min());

    int64_t h;
    if (a < 0) a = -a;
    if (b < 0) b = -b;

    if (a == 0) return b;
    if (b == 0) return a;

    do {
      h = a % b;
      a = b;
      b = h;
    } while (b != 0);

    return a;
  }